

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitBinaryInt
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,OpCodeAsmJs op)

{
  EmitInfoBase R0;
  ParseNode *pnode_00;
  ParseNode *this_00;
  ParseNodeInt *pPVar1;
  AsmJsCompilationException *this_01;
  undefined4 uVar2;
  undefined8 in_RCX;
  bool bVar4;
  AsmJsRetType local_50;
  undefined4 local_4c;
  EmitExpressionInfo local_48;
  EmitExpressionInfo local_40;
  EmitExpressionInfo local_38;
  undefined7 uVar3;
  
  pnode_00 = ParserWrapper::GetBinaryLeft(pnode);
  this_00 = ParserWrapper::GetBinaryRight(pnode);
  if (this_00->nop == knopInt) {
    pPVar1 = ParseNode::AsParseNodeInt(this_00);
    bVar4 = pPVar1->lw == 0;
    uVar3 = (undefined7)((ulong)in_RCX >> 8);
    uVar2 = (undefined4)CONCAT71(uVar3,bVar4);
    if ((op == Or_Int && bVar4) &&
       (uVar2 = (undefined4)CONCAT71(uVar3,1), pnode_00->nop == knopCall)) {
      AsmJsRetType::AsmJsRetType(&local_50,Signed);
      local_48 = EmitCall(this,pnode_00,local_50);
      bVar4 = AsmJsType::isIntish(&local_48.type);
      if (bVar4) {
        local_48.type.which_ = Signed;
        return local_48;
      }
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,
                 L"Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish"
                );
      goto LAB_00864911;
    }
  }
  else {
    uVar2 = 0;
  }
  local_4c = uVar2;
  local_40 = Emit(this,pnode_00);
  local_38 = Emit(this,this_00);
  bVar4 = AsmJsType::isIntish(&local_40.type);
  if ((bVar4) && (bVar4 = AsmJsType::isIntish(&local_38.type), bVar4)) {
    bVar4 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&local_40);
    if (bVar4) {
      bVar4 = AsmJsFunc::IsValidLocation<int>(this->mFunction,&local_38);
      if (bVar4) {
        StartStatement(this,pnode);
        local_48 = (EmitExpressionInfo)
                   ((ulong)CONCAT14(op == Shr_UInt,local_48.super_EmitInfoBase.location) |
                   0xa00000000);
        if (((byte)local_4c & op != And_Int) == 0) {
          R0.location = GetAndReleaseBinaryLocations<int>(this,&local_40,&local_38);
          AsmJsByteCodeWriter::AsmReg3
                    (&this->mWriter,op,R0.location,local_40.super_EmitInfoBase.location,
                     local_38.super_EmitInfoBase.location);
        }
        else {
          AsmJsFunc::ReleaseLocation<int>(this->mFunction,&local_38);
          R0.location = local_40.super_EmitInfoBase.location;
        }
        local_48.super_EmitInfoBase.location = R0.location;
        ByteCodeWriter::EndStatement(&(this->mWriter).super_ByteCodeWriter,pnode);
        return local_48;
      }
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Invalid Node location[%d] ",(ulong)local_38 & 0xffffffff);
    }
    else {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Invalid Node location[%d] ",(ulong)local_40 & 0xffffffff);
    }
  }
  else {
    this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_01,
               L"Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish");
  }
LAB_00864911:
  __cxa_throw(this_01,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitBinaryInt( ParseNode * pnode, OpCodeAsmJs op )
    {
        ParseNode* lhs = ParserWrapper::GetBinaryLeft( pnode );
        ParseNode* rhs = ParserWrapper::GetBinaryRight( pnode );
        const bool isRhs0 = rhs->nop == knopInt && rhs->AsParseNodeInt()->lw == 0;
        const bool isOr0Operation = op == OpCodeAsmJs::Or_Int && isRhs0;
        if( isOr0Operation && lhs->nop == knopCall )
        {
            EmitExpressionInfo info = EmitCall(lhs, AsmJsRetType::Signed);
            if (!info.type.isIntish())
            {
                throw AsmJsCompilationException(_u("Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish"));
            }
            info.type = AsmJsType::Signed;
            return info;
        }
        const EmitExpressionInfo& lhsEmit = Emit( lhs );
        const EmitExpressionInfo& rhsEmit = Emit( rhs );
        const AsmJsType& lType = lhsEmit.type;
        const AsmJsType& rType = rhsEmit.type;
        if( !lType.isIntish() || !rType.isIntish() )
        {
            throw AsmJsCompilationException( _u("Invalid type for [| & ^ >> << >>>] left and right operand must be of type intish") );
        }
        CheckNodeLocation( lhsEmit, int );
        CheckNodeLocation( rhsEmit, int );
        StartStatement(pnode);
        EmitExpressionInfo emitInfo( AsmJsType::Signed );
        if( op == OpCodeAsmJs::Shr_UInt )
        {
            emitInfo.type = AsmJsType::Unsigned;
        }
        // ignore this specific operation, useful for non asm.js
        if( !isRhs0 || op == OpCodeAsmJs::And_Int )
        {
            RegSlot dstReg = GetAndReleaseBinaryLocations<int>( &lhsEmit, &rhsEmit );
            mWriter.AsmReg3( op, dstReg, lhsEmit.location, rhsEmit.location );
            emitInfo.location = dstReg;
        }
        else
        {
            mFunction->ReleaseLocation<int>( &rhsEmit );
            emitInfo.location = lhsEmit.location;
        }
        EndStatement(pnode);
        return emitInfo;
    }